

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O0

int avl_comp_ifaddr(void *k1,void *k2)

{
  netaddr *n2;
  netaddr *n1;
  void *k2_local;
  void *k1_local;
  
  if (*(byte *)((long)k2 + 0x10) < *(byte *)((long)k1 + 0x10)) {
    k1_local._4_4_ = 1;
  }
  else if (*(byte *)((long)k1 + 0x10) < *(byte *)((long)k2 + 0x10)) {
    k1_local._4_4_ = -1;
  }
  else {
    k1_local._4_4_ = memcmp(k1,k2,0x10);
  }
  return k1_local._4_4_;
}

Assistant:

static int
avl_comp_ifaddr(const void *k1, const void *k2) {
  const struct netaddr *n1 = k1;
  const struct netaddr *n2 = k2;

  if (netaddr_get_address_family(n1) > netaddr_get_address_family(n2)) {
    return 1;
  }
  if (netaddr_get_address_family(n1) < netaddr_get_address_family(n2)) {
    return -1;
  }

  return memcmp(n1, n2, 16);
}